

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O3

void __thiscall Server::Private::interrupt(Private *this)

{
  bool bVar1;
  
  Mutex::lock(&this->_interruptMutex);
  bVar1 = this->_interrupted;
  if (bVar1 == false) {
    this->_interrupted = true;
  }
  Mutex::unlock(&this->_interruptMutex);
  if (bVar1 != false) {
    return;
  }
  Socket::Poll::interrupt(&this->_sockets);
  return;
}

Assistant:

void Server::Private::interrupt()
{
  {
    Mutex::Guard guard(_interruptMutex);
    if (_interrupted)
      return;
    _interrupted = true;
  }
  _sockets.interrupt();
}